

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

bool compareActualValue(DataType datatype,XSValue_Data actValue,XSValue_Data expValue)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  XMLCh *pXVar9;
  char *pcVar10;
  double dVar11;
  double dVar12;
  StrX local_b8;
  StrX local_a8;
  StrX local_98;
  uint local_84;
  undefined1 local_80 [4];
  uint i;
  StrX local_70;
  StrX local_60;
  StrX local_50;
  StrX local_40 [2];
  StrX local_20;
  DataType local_10;
  bool local_9;
  DataType datatype_local;
  
  uVar2 = actValue.fValue.f_int;
  uVar4 = actValue.fValue.f_datetime.f_month;
  uVar3 = actValue.fValue.f_long;
  uVar6 = expValue.fValue.f_int;
  uVar8 = expValue.fValue.f_datetime.f_month;
  uVar7 = expValue.fValue.f_long;
  uVar1 = actValue.fValue.f_bool;
  uVar5 = expValue.fValue.f_bool;
  local_10 = datatype;
  switch(datatype) {
  case dt_string:
  case dt_anyURI:
  case dt_QName:
  case dt_NOTATION:
  case dt_normalizedString:
  case dt_token:
  case dt_language:
  case dt_NMTOKEN:
  case dt_NMTOKENS:
  case dt_Name:
  case dt_NCName:
  case dt_ID:
  case dt_IDREF:
  case dt_IDREFS:
  case dt_ENTITY:
  case dt_ENTITIES:
    pXVar9 = getDataTypeString(datatype);
    StrX::StrX(&local_98,pXVar9);
    pcVar10 = StrX::localForm(&local_98);
    printf("ACTVALUE_TEST no Actual Value for datatype %s\n",pcVar10);
    StrX::~StrX(&local_98);
    local_9 = false;
    break;
  case dt_boolean:
    if ((uVar1 & 1) == (uVar5 & 1)) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected XSValue for dt_boolean, got %d expected %d\n",
             (ulong)(byte)uVar1 & 1,(ulong)(uVar5 & 1),
             CONCAT71((int7)((ulong)&actValue >> 8),uVar1) & 0xffffffffffffff01);
      local_9 = false;
    }
    break;
  case dt_decimal:
    if (ABS((double)uVar3) / 1000.0 <= ABS((double)uVar3 - (double)uVar7)) {
      pXVar9 = getDataTypeString(datatype);
      StrX::StrX(&local_20,pXVar9);
      pcVar10 = StrX::localForm(&local_20);
      printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n",
             actValue.fValue.f_long,uVar7,pcVar10);
      StrX::~StrX(&local_20);
      local_9 = false;
    }
    else {
      local_9 = true;
    }
    break;
  case dt_float:
    if (uVar4 == 4) {
      dVar11 = std::fabs((double)(ulong)(uint)((float)uVar2 - (float)uVar6));
      dVar12 = std::fabs((double)(ulong)actValue.fValue.f_uint);
      if (SUB84(dVar12,0) / 1000.0 <= SUB84(dVar11,0)) {
        pXVar9 = getDataTypeString(local_10);
        StrX::StrX(&local_60,pXVar9);
        pcVar10 = StrX::localForm(&local_60);
        printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n",
               (double)actValue.fValue.f_float,(double)(float)uVar6,pcVar10);
        StrX::~StrX(&local_60);
        local_9 = false;
      }
      else {
        local_9 = true;
      }
    }
    else if (uVar4 == uVar8) {
      local_9 = true;
    }
    else {
      pXVar9 = getDataTypeString(datatype);
      StrX::StrX(&local_70,pXVar9);
      pcVar10 = StrX::localForm(&local_70);
      printf("ACTVALUE_TEST Unexpected XSValue enum for datatype %s, got %d expected %d\n",pcVar10,
             (ulong)actValue.fValue.f_floatType.f_floatEnum,(ulong)(uint)uVar8);
      StrX::~StrX(&local_70);
      local_9 = false;
    }
    break;
  case dt_double:
    if (actValue.fValue.f_datetime.f_day == 4) {
      if (ABS((double)uVar3) / 1000.0 <= ABS((double)uVar3 - (double)uVar7)) {
        pXVar9 = getDataTypeString(datatype);
        StrX::StrX(local_40,pXVar9);
        pcVar10 = StrX::localForm(local_40);
        printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n",
               actValue.fValue.f_long,uVar7,pcVar10);
        StrX::~StrX(local_40);
        local_9 = false;
      }
      else {
        local_9 = true;
      }
    }
    else if (actValue.fValue.f_datetime.f_day == expValue.fValue.f_datetime.f_day) {
      local_9 = true;
    }
    else {
      pXVar9 = getDataTypeString(datatype);
      StrX::StrX(&local_50,pXVar9);
      pcVar10 = StrX::localForm(&local_50);
      printf("ACTVALUE_TEST Unexpected XSValue enum for datatype %s, got %d expected %d\n",pcVar10,
             (ulong)actValue.fValue.f_doubleType.f_doubleEnum,
             (ulong)expValue.fValue.f_doubleType.f_doubleEnum);
      StrX::~StrX(&local_50);
      local_9 = false;
    }
    break;
  case dt_duration:
  case dt_dateTime:
  case dt_time:
  case dt_date:
  case dt_gYearMonth:
  case dt_gYear:
  case dt_gMonthDay:
  case dt_gDay:
  case dt_gMonth:
    if ((((uVar2 != uVar6) || (uVar4 != uVar8)) ||
        (actValue.fValue.f_datetime.f_day != expValue.fValue.f_datetime.f_day)) ||
       (((actValue.fValue.f_datetime.f_hour != expValue.fValue.f_datetime.f_hour ||
         (actValue.fValue.f_datetime.f_min != expValue.fValue.f_datetime.f_min)) ||
        ((actValue.fValue.f_datetime.f_second != expValue.fValue.f_datetime.f_second ||
         (0.01 <= ABS(actValue.fValue.f_datetime.f_milisec - expValue.fValue.f_datetime.f_milisec)))
        )))) {
      pXVar9 = getDataTypeString(datatype);
      StrX::StrX((StrX *)local_80,pXVar9);
      pcVar10 = StrX::localForm((StrX *)local_80);
      printf("ACTVALUE_TEST Unexpected %s XSValue\n",pcVar10);
      StrX::~StrX((StrX *)local_80);
      printf(" Actual year = %d, month = %d, day = %d, hour = %d, min = %d, second = %d, milisec = %f\n"
             ,actValue.fValue.f_datetime.f_milisec,(ulong)actValue.fValue.f_uint,
             (ulong)actValue.fValue.f_floatType.f_floatEnum,
             (ulong)actValue.fValue.f_doubleType.f_doubleEnum,
             (ulong)(uint)actValue.fValue.f_datetime.f_hour,
             (ulong)(uint)actValue.fValue.f_datetime.f_min,actValue.fValue.f_datetime.f_second);
      printf(" Expect year = %d, month = %d, day = %d, hour = %d, min = %d, second = %d, milisec = %f\n"
             ,expValue.fValue.f_datetime.f_milisec,(ulong)(uint)uVar6,(ulong)(uint)uVar8,
             (ulong)expValue.fValue.f_doubleType.f_doubleEnum,
             (ulong)(uint)expValue.fValue.f_datetime.f_hour,
             (ulong)(uint)expValue.fValue.f_datetime.f_min,expValue.fValue.f_datetime.f_second);
      local_9 = false;
    }
    else {
      local_9 = true;
    }
    break;
  case dt_hexBinary:
    if ((*(XMLByte *)uVar3 == *(XMLByte *)uVar7) && (*(char *)(uVar3 + 1) == *(char *)(uVar7 + 1)))
    {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected hexBinary value\n");
      printf(" Actual Value = %x:%x\n",(ulong)*actValue.fValue.f_byteVal,
             (ulong)*(byte *)(actValue.fValue.f_long + 1));
      printf(" Expect Value = %x:%x\n",(ulong)*(byte *)uVar7,(ulong)*(byte *)(uVar7 + 1));
      local_9 = false;
    }
    break;
  case dt_base64Binary:
    for (local_84 = 0; local_84 < 9; local_84 = local_84 + 1) {
      if (*(char *)(uVar7 + (ulong)local_84) == '\0') {
        return true;
      }
      if (*(char *)(uVar3 + (ulong)local_84) != *(char *)(uVar7 + (ulong)local_84)) {
        printf("ACTVALUE_TEST Unexpected base64Binary value for byte %d\n",(ulong)local_84);
        printf(" Actual Value = %x\n",
               (ulong)*(byte *)((long)actValue.fValue.f_strVal + (ulong)local_84));
        printf(" Expect Value = %x\n",(ulong)*(byte *)(uVar7 + (ulong)local_84));
        return false;
      }
    }
    local_9 = true;
    break;
  case dt_integer:
  case dt_nonPositiveInteger:
  case dt_negativeInteger:
  case dt_long:
    if (uVar3 == uVar7) {
      local_9 = true;
    }
    else {
      pXVar9 = getDataTypeString(datatype);
      StrX::StrX(&local_a8,pXVar9);
      pcVar10 = StrX::localForm(&local_a8);
      printf("ACTVALUE_TEST Unexpected %s XSValue, got %ld expected %ld\n",pcVar10,
             actValue.fValue.f_long,uVar7);
      StrX::~StrX(&local_a8);
      local_9 = false;
    }
    break;
  case dt_int:
    if (uVar2 == uVar6) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",(ulong)(uint)uVar2,
             (ulong)(uint)uVar6);
      local_9 = false;
    }
    break;
  case dt_short:
    if (actValue.fValue.f_short == expValue.fValue.f_short) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected dt_short XSValue, got %d expected %d\n",
             (ulong)(uint)(int)actValue.fValue.f_short,(ulong)(uint)(int)expValue.fValue.f_short);
      local_9 = false;
    }
    break;
  case dt_byte:
    if (uVar1 == uVar5) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",
             (ulong)(uint)(int)(char)uVar1,(ulong)(uint)(int)(char)uVar5);
      local_9 = false;
    }
    break;
  case dt_nonNegativeInteger:
  case dt_unsignedLong:
  case dt_positiveInteger:
    if (uVar3 == uVar7) {
      local_9 = true;
    }
    else {
      pXVar9 = getDataTypeString(datatype);
      StrX::StrX(&local_b8,pXVar9);
      pcVar10 = StrX::localForm(&local_b8);
      printf("ACTVALUE_TEST Unexpected %s XSValue, got %lu expected %lu\n",pcVar10,
             actValue.fValue.f_long,uVar7);
      StrX::~StrX(&local_b8);
      local_9 = false;
    }
    break;
  case dt_unsignedInt:
    if (uVar2 == uVar6) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",
             (ulong)(uint)uVar2,(ulong)(uint)uVar6);
      local_9 = false;
    }
    break;
  case dt_unsignedShort:
    if (actValue.fValue.f_short == expValue.fValue.f_short) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected dt_unsignedShort XSValue, got %d expected %d\n",
             (ulong)actValue.fValue.f_ushort,(ulong)expValue.fValue.f_ushort);
      local_9 = false;
    }
    break;
  case dt_unsignedByte:
    if (uVar1 == uVar5) {
      local_9 = true;
    }
    else {
      printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",
             (ulong)(byte)uVar1,(ulong)(byte)uVar5);
      local_9 = false;
    }
    break;
  default:
    printf("ACTVALUE_TEST Unexpected datatype\n");
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool compareActualValue( const XSValue::DataType             datatype
                              , const XSValue::XSValue_Data         actValue
                              , const XSValue::XSValue_Data         expValue)
{
    switch (datatype) {
        case XSValue::dt_boolean:
            if (actValue.fValue.f_bool == expValue.fValue.f_bool)
                return true;
            printf("ACTVALUE_TEST Unexpected XSValue for dt_boolean, got %d expected %d\n",
                    actValue.fValue.f_bool, expValue.fValue.f_bool);
            return false;

        case XSValue::dt_decimal:
            if (fabs(actValue.fValue.f_double - expValue.fValue.f_double) < fabs(actValue.fValue.f_double)/1000)
                return true;
            printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n", StrX(getDataTypeString(datatype)).localForm(),
                actValue.fValue.f_double, expValue.fValue.f_double);
            return false;
        case XSValue::dt_double:
            if (actValue.fValue.f_doubleType.f_doubleEnum == XSValue::DoubleFloatType_Normal) {
                if (fabs(actValue.fValue.f_double - expValue.fValue.f_double) < fabs(actValue.fValue.f_double)/1000)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_double, expValue.fValue.f_double);
                return false;
            }
            else {
                if (actValue.fValue.f_doubleType.f_doubleEnum == expValue.fValue.f_doubleType.f_doubleEnum)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue enum for datatype %s, got %d expected %d\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_doubleType.f_doubleEnum, expValue.fValue.f_doubleType.f_doubleEnum);
                return false;
            }
        case XSValue::dt_float:
            if (actValue.fValue.f_floatType.f_floatEnum == XSValue::DoubleFloatType_Normal) {
                if (fabs(actValue.fValue.f_float - expValue.fValue.f_float) < fabs(actValue.fValue.f_float)/1000)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue for datatype %s, got %f expected %f\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_float, expValue.fValue.f_float);
                return false;
            }
            else {
                if (actValue.fValue.f_floatType.f_floatEnum == expValue.fValue.f_floatType.f_floatEnum)
                    return true;
                printf("ACTVALUE_TEST Unexpected XSValue enum for datatype %s, got %d expected %d\n", StrX(getDataTypeString(datatype)).localForm(),
                        actValue.fValue.f_floatType.f_floatEnum, expValue.fValue.f_floatType.f_floatEnum);
                return false;
            }
        case XSValue::dt_duration:
        case XSValue::dt_dateTime:
        case XSValue::dt_time:
        case XSValue::dt_date:
        case XSValue::dt_gYearMonth:
        case XSValue::dt_gYear:
        case XSValue::dt_gMonthDay:
        case XSValue::dt_gDay:
        case XSValue::dt_gMonth:
            if (actValue.fValue.f_datetime.f_year   == expValue.fValue.f_datetime.f_year   &&
                actValue.fValue.f_datetime.f_month  == expValue.fValue.f_datetime.f_month  &&
                actValue.fValue.f_datetime.f_day    == expValue.fValue.f_datetime.f_day    &&
                actValue.fValue.f_datetime.f_hour   == expValue.fValue.f_datetime.f_hour   &&
                actValue.fValue.f_datetime.f_min    == expValue.fValue.f_datetime.f_min    &&
                actValue.fValue.f_datetime.f_second == expValue.fValue.f_datetime.f_second &&
                (fabs(actValue.fValue.f_datetime.f_milisec  - expValue.fValue.f_datetime.f_milisec) < 0.01))
                return true;
            printf("ACTVALUE_TEST Unexpected %s XSValue\n", StrX(getDataTypeString(datatype)).localForm());
            printf(" Actual year = %d, month = %d, day = %d, hour = %d, min = %d, second = %d, milisec = %f\n",
                actValue.fValue.f_datetime.f_year, actValue.fValue.f_datetime.f_month, actValue.fValue.f_datetime.f_day,
                actValue.fValue.f_datetime.f_hour, actValue.fValue.f_datetime.f_min, actValue.fValue.f_datetime.f_second, actValue.fValue.f_datetime.f_milisec);
            printf(" Expect year = %d, month = %d, day = %d, hour = %d, min = %d, second = %d, milisec = %f\n",
                expValue.fValue.f_datetime.f_year, expValue.fValue.f_datetime.f_month, expValue.fValue.f_datetime.f_day,
                expValue.fValue.f_datetime.f_hour, expValue.fValue.f_datetime.f_min, expValue.fValue.f_datetime.f_second, expValue.fValue.f_datetime.f_milisec);
            return false;

        case XSValue::dt_hexBinary:
            // in the tests in this file the hexBinary data is always 2 long...
            if (actValue.fValue.f_byteVal[0] == expValue.fValue.f_byteVal[0] &&
                actValue.fValue.f_byteVal[1] == expValue.fValue.f_byteVal[1])
                return true;
            printf("ACTVALUE_TEST Unexpected hexBinary value\n");
            printf(" Actual Value = %x:%x\n",actValue.fValue.f_byteVal[0],actValue.fValue.f_byteVal[1]);
            printf(" Expect Value = %x:%x\n",expValue.fValue.f_byteVal[0],expValue.fValue.f_byteVal[1]);
            return false;

        case XSValue::dt_base64Binary:
            // in the tests in this file the base64Binary data is always 9 long (XMLByte[9])
            // however, a zero byte is used to indicate when the smaller data stream is empty
            {
                for (unsigned int i=0; i<9; i++)
                {
                    if (!expValue.fValue.f_byteVal[i])
                        return true;
                    if (actValue.fValue.f_byteVal[i] != expValue.fValue.f_byteVal[i])
                    {
                        printf("ACTVALUE_TEST Unexpected base64Binary value for byte %d\n", i);
                        printf(" Actual Value = %x\n",actValue.fValue.f_byteVal[i]);
                        printf(" Expect Value = %x\n",expValue.fValue.f_byteVal[i]);
                        return false;
                    }
                }
                return true;
            }

        case XSValue::dt_string:
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_IDREFS:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
            printf("ACTVALUE_TEST no Actual Value for datatype %s\n", StrX(getDataTypeString(datatype)).localForm());
            return false;

        case XSValue::dt_integer:
        case XSValue::dt_nonPositiveInteger:
        case XSValue::dt_negativeInteger:
        case XSValue::dt_long:
            if (actValue.fValue.f_long == expValue.fValue.f_long)
                return true;
            printf("ACTVALUE_TEST Unexpected %s XSValue, got %ld expected %ld\n", StrX(getDataTypeString(datatype)).localForm(),
                    actValue.fValue.f_long, expValue.fValue.f_long);
            return false;

        case XSValue::dt_int:
            if (actValue.fValue.f_int == expValue.fValue.f_int)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_int XSValue, got %d expected %d\n",
                    actValue.fValue.f_int, expValue.fValue.f_int);
            return false;
        case XSValue::dt_short:
            if (actValue.fValue.f_short == expValue.fValue.f_short)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_short XSValue, got %d expected %d\n",
                    actValue.fValue.f_short, expValue.fValue.f_short);
            return false;
        case XSValue::dt_byte:
            if (actValue.fValue.f_char == expValue.fValue.f_char)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_byte XSValue, got %d expected %d\n",
                    actValue.fValue.f_char, expValue.fValue.f_char);
            return false;
        case XSValue::dt_nonNegativeInteger:
        case XSValue::dt_unsignedLong:
        case XSValue::dt_positiveInteger:
            if (actValue.fValue.f_ulong == expValue.fValue.f_ulong)
                return true;
            printf("ACTVALUE_TEST Unexpected %s XSValue, got %lu expected %lu\n", StrX(getDataTypeString(datatype)).localForm(),
                    actValue.fValue.f_ulong, expValue.fValue.f_ulong);
            return false;
        case XSValue::dt_unsignedInt:
            if (actValue.fValue.f_uint == expValue.fValue.f_uint)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",
                    actValue.fValue.f_uint, expValue.fValue.f_uint);
            return false;
        case XSValue::dt_unsignedShort:
            if (actValue.fValue.f_ushort == expValue.fValue.f_ushort)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_unsignedShort XSValue, got %d expected %d\n",
                    actValue.fValue.f_ushort, expValue.fValue.f_ushort);
            return false;
        case XSValue::dt_unsignedByte:
            if (actValue.fValue.f_uchar == expValue.fValue.f_uchar)
                return true;
            printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",
                    actValue.fValue.f_uchar, expValue.fValue.f_uchar);
            return false;
        default:
            printf("ACTVALUE_TEST Unexpected datatype\n");
            return false;
    }
}